

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview_p.hpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewSectionPrivate::TableViewSectionPrivate
          (TableViewSectionPrivate *this,TableViewSection *parent)

{
  TableViewSection *parent_local;
  TableViewSectionPrivate *this_local;
  
  this->_vptr_TableViewSectionPrivate = (_func_int **)&PTR__TableViewSectionPrivate_002364e0;
  this->q = parent;
  this->header = (TextLabel *)0x0;
  this->footer = (TextLabel *)0x0;
  QList<QtMWidgets::TableViewCell_*>::QList(&this->cells);
  this->layout = (QVBoxLayout *)0x0;
  QList<QtMWidgets::RowsSeparator_*>::QList(&this->separators);
  this->highlightCellOnClick = false;
  return;
}

Assistant:

TableViewSectionPrivate( TableViewSection * parent )
		:	q( parent )
		,	header( 0 )
		,	footer( 0 )
		,	layout( 0 )
		,	highlightCellOnClick( false )
	{
	}